

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Bad.c
# Opt level: O2

DdNode * Llb_BddQuantifyPis(Aig_Man_t *pInit,DdManager *dd,DdNode *bFunc)

{
  abctime aVar1;
  int iVar2;
  DdNode *n;
  DdNode *pDVar3;
  
  iVar2 = Cudd_ReadSize(dd);
  if (iVar2 == pInit->nObjs[2]) {
    aVar1 = dd->TimeStop;
    dd->TimeStop = 0;
    n = Cudd_ReadOne(dd);
    Cudd_Ref(n);
    for (iVar2 = 0; iVar2 < pInit->nTruePis; iVar2 = iVar2 + 1) {
      Vec_PtrEntry(pInit->vCis,iVar2);
      pDVar3 = Cudd_bddIthVar(dd,pInit->nRegs + iVar2);
      pDVar3 = Cudd_bddAnd(dd,n,pDVar3);
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,n);
      n = pDVar3;
    }
    pDVar3 = Cudd_bddExistAbstract(dd,bFunc,n);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n);
    Cudd_Deref(pDVar3);
    dd->TimeStop = aVar1;
    return pDVar3;
  }
  __assert_fail("Cudd_ReadSize(dd) == Aig_ManCiNum(pInit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Bad.c"
                ,0x73,"DdNode *Llb_BddQuantifyPis(Aig_Man_t *, DdManager *, DdNode *)");
}

Assistant:

DdNode * Llb_BddQuantifyPis( Aig_Man_t * pInit, DdManager * dd, DdNode * bFunc )
{
    DdNode * bVar, * bCube, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    assert( Cudd_ReadSize(dd) == Aig_ManCiNum(pInit) );
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    // create PI cube
    bCube = Cudd_ReadOne( dd );  Cudd_Ref( bCube );
    Saig_ManForEachPi( pInit, pObj, i )    {
        bVar  = Cudd_bddIthVar( dd, Aig_ManRegNum(pInit) + i );
        bCube = Cudd_bddAnd( dd, bTemp = bCube, bVar );  Cudd_Ref( bCube );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // quantify PI cube
    bFunc = Cudd_bddExistAbstract( dd, bFunc, bCube );  Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( dd, bCube );
    Cudd_Deref( bFunc );
    dd->TimeStop = TimeStop;
    return bFunc;
}